

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O1

packet_t * parse_pkt(uint8_t *data,int len)

{
  ip_t *piVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  packet_t *ppVar5;
  uint8_t *puVar6;
  ushort *puVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  
  if (data == (uint8_t *)0x0) {
    _log(in_XMM0_Qa);
    return (packet_t *)0x0;
  }
  ppVar5 = (packet_t *)new(0x60);
  ppVar5->len = len;
  ppVar5->payload = len;
  puVar6 = (uint8_t *)new((long)len);
  ppVar5->data = puVar6;
  memcpy(puVar6,data,(long)len);
  __x_00 = __x;
  if (ppVar5->len < 0xe) {
    __x_00 = _log(__x);
  }
  puVar6 = ppVar5->data;
  iVar3 = ppVar5->offset;
  ppVar5->eth = (eth_t *)(puVar6 + iVar3);
  ppVar5->offset = iVar3 + 0xe;
  ppVar5->payload = ppVar5->payload + -0xe;
  puVar7 = (ushort *)(puVar6 + (long)iVar3 + 2);
  uVar8 = *(ushort *)(puVar6 + (long)iVar3 + 0xc) << 8 |
          *(ushort *)(puVar6 + (long)iVar3 + 0xc) >> 8;
  ppVar5->eth_type = uVar8;
  do {
    if (uVar8 < 0x9100) {
      if ((uVar8 != 0x8100) && (uVar8 != 0x88a8)) {
        if (uVar8 != 0x800) {
          return ppVar5;
        }
        if (ppVar5->payload < 0x14) {
          __x_00 = _log(__x_00);
        }
        iVar3 = ppVar5->offset;
        piVar1 = (ip_t *)(ppVar5->data + iVar3);
        ppVar5->ip = piVar1;
        uVar9 = ppVar5->data[iVar3] & 0xf;
        iVar10 = uVar9 * 4;
        iVar4 = ppVar5->payload + uVar9 * -4;
        if (SBORROW4(ppVar5->payload,iVar10) == iVar4 < 0) {
          ppVar5->offset = iVar3 + iVar10;
          ppVar5->payload = iVar4;
          uVar2 = piVar1->proto;
          ppVar5->ip_proto = uVar2;
          if (uVar2 == '\x11') {
            if (iVar4 < 8) {
              _log(__x_00);
            }
            ppVar5->udp = (udp_t *)(ppVar5->data + ppVar5->offset);
            ppVar5->offset = ppVar5->offset + 8;
            ppVar5->payload = ppVar5->payload + -8;
            return ppVar5;
          }
          if (uVar2 != '\x06') {
            return ppVar5;
          }
          if (iVar4 < 0x14) {
            __x_00 = _log(__x_00);
          }
          iVar3 = ppVar5->offset;
          ppVar5->tcp = (tcp_t *)(ppVar5->data + iVar3);
          uVar9 = ppVar5->data[(long)iVar3 + 0xc] >> 2 & 0x3c;
          if ((int)uVar9 <= ppVar5->payload) {
            ppVar5->offset = iVar3 + uVar9;
            ppVar5->payload = ppVar5->payload - uVar9;
            return ppVar5;
          }
        }
LAB_00105755:
        _log(__x_00);
        return ppVar5;
      }
    }
    else if ((uVar8 != 0x9200) && (uVar8 != 0x9100)) {
      return ppVar5;
    }
    if (ppVar5->payload < 4) goto LAB_00105755;
    uVar8 = *puVar7 << 8 | *puVar7 >> 8;
    ppVar5->eth_type = uVar8;
    ppVar5->offset = ppVar5->offset + 4;
    ppVar5->payload = ppVar5->payload + -4;
    puVar7 = puVar7 + 2;
  } while( true );
}

Assistant:

packet_t *parse_pkt(const uint8_t *data, int len)
{
	if (0 > len && len > 65535) {
		log_err("%s packet len %d is invalid\n", __FUNCTION__, len);
		return NULL;
	}

	if (!data) {
		log_err("%s data is null\n",  __FUNCTION__);
		return NULL;
	}

	packet_t *pkt = _new(packet_t);
	pkt->len = len;
	pkt->payload = len;
	pkt->data = new(len);
	memcpy(pkt->data, data, len);
	parse_eth(pkt);

	return pkt;
}